

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::detail::fallback_format<double>
               (double d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  type tVar5;
  uint64_t n;
  char *pcVar6;
  bool bVar7;
  char local_37d;
  bool local_359;
  int local_358;
  int i_1;
  int overflow;
  int result;
  int digit;
  int digit_2;
  int i;
  int result_1;
  bool high;
  bool low;
  int digit_1;
  char *data;
  bool even;
  uint64_t significand;
  int shift;
  bool is_predecessor_closer;
  fp value;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  undefined1 local_188 [8];
  bigint denominator;
  bigint numerator;
  int *exp10_local;
  buffer<char> *buf_local;
  bool binary32_local;
  int num_digits_local;
  double d_local;
  
  bigint::bigint((bigint *)&denominator.exp_);
  bigint::bigint((bigint *)local_188);
  bigint::bigint((bigint *)&upper_store.exp_);
  bigint::bigint((bigint *)&upper);
  value.e = 0;
  value._12_4_ = 0;
  fp::fp((fp *)&shift);
  if (binary32) {
    local_359 = fp::assign<float,_0>((fp *)&shift,(float)d);
  }
  else {
    local_359 = fp::assign<double,_0>((fp *)&shift,d);
  }
  iVar2 = 1;
  if (local_359 != false) {
    iVar2 = 2;
  }
  n = _shift << (sbyte)iVar2;
  if ((int)value.f < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10((bigint *)&denominator.exp_,-*exp10);
      bigint::assign((bigint *)&upper_store.exp_,(bigint *)&denominator.exp_);
      if (iVar2 != 1) {
        bigint::assign((bigint *)&upper,(bigint *)&denominator.exp_);
        bigint::operator<<=((bigint *)&upper,1);
        value._8_8_ = &upper;
      }
      bigint::operator*=((bigint *)&denominator.exp_,n);
      bigint::assign((bigint *)local_188,1);
      bigint::operator<<=((bigint *)local_188,iVar2 - (int)value.f);
    }
    else {
      bigint::assign((bigint *)&denominator.exp_,n);
      bigint::assign_pow10((bigint *)local_188,*exp10);
      bigint::operator<<=((bigint *)local_188,iVar2 - (int)value.f);
      bigint::assign((bigint *)&upper_store.exp_,1);
      if (iVar2 != 1) {
        bigint::assign((bigint *)&upper,2);
        value._8_8_ = &upper;
      }
    }
  }
  else {
    bigint::assign((bigint *)&denominator.exp_,n);
    bigint::operator<<=((bigint *)&denominator.exp_,(int)value.f);
    bigint::assign((bigint *)&upper_store.exp_,1);
    bigint::operator<<=((bigint *)&upper_store.exp_,(int)value.f);
    if (iVar2 != 1) {
      bigint::assign((bigint *)&upper,1);
      bigint::operator<<=((bigint *)&upper,(int)value.f + 1);
      value._8_8_ = &upper;
    }
    bigint::assign_pow10((bigint *)local_188,*exp10);
    bigint::operator<<=((bigint *)local_188,iVar2);
  }
  if (num_digits < 0) {
    if (value._8_8_ == 0) {
      value._8_8_ = &upper_store.exp_;
    }
    bVar7 = (_shift & 1) == 0;
    buf_local._4_4_ = 0;
    pcVar6 = buffer<char>::data(buf);
    while( true ) {
      iVar2 = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_188);
      iVar3 = compare((bigint *)&denominator.exp_,(bigint *)&upper_store.exp_);
      iVar3 = iVar3 - (uint)bVar7;
      iVar4 = add_compare((bigint *)&denominator.exp_,(bigint *)value._8_8_,(bigint *)local_188);
      bVar1 = 0 < (int)(iVar4 + (uint)bVar7);
      iVar4 = buf_local._4_4_ + 1;
      pcVar6[buf_local._4_4_] = (char)iVar2 + '0';
      if ((iVar3 < 0) || (bVar1)) break;
      bigint::operator*=((bigint *)&denominator.exp_,10);
      bigint::operator*=((bigint *)&upper_store.exp_,10);
      buf_local._4_4_ = iVar4;
      if ((int *)value._8_8_ != &upper_store.exp_) {
        bigint::operator*=((bigint *)value._8_8_,10);
      }
    }
    if (iVar3 < 0) {
      if ((bVar1) &&
         ((iVar3 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                               (bigint *)local_188), 0 < iVar3 || ((iVar3 == 0 && (iVar2 % 2 != 0)))
          ))) {
        pcVar6[buf_local._4_4_] = pcVar6[buf_local._4_4_] + '\x01';
      }
    }
    else {
      pcVar6[buf_local._4_4_] = pcVar6[buf_local._4_4_] + '\x01';
    }
    tVar5 = to_unsigned<int>(iVar4);
    buffer<char>::try_resize(buf,(ulong)tVar5);
    *exp10 = *exp10 - buf_local._4_4_;
  }
  else {
    *exp10 = *exp10 - (num_digits + -1);
    if (num_digits == 0) {
      buffer<char>::try_resize(buf,1);
      bigint::operator*=((bigint *)local_188,10);
      iVar2 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                          (bigint *)local_188);
      local_37d = '1';
      if (iVar2 < 1) {
        local_37d = '0';
      }
      pcVar6 = buffer<char>::operator[]<int>(buf,0);
      *pcVar6 = local_37d;
    }
    else {
      tVar5 = to_unsigned<int>(num_digits);
      buffer<char>::try_resize(buf,(ulong)tVar5);
      for (digit = 0; digit < num_digits + -1; digit = digit + 1) {
        iVar2 = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_188);
        result._0_1_ = (char)iVar2;
        pcVar6 = buffer<char>::operator[]<int>(buf,digit);
        *pcVar6 = (char)result + '0';
        bigint::operator*=((bigint *)&denominator.exp_,10);
      }
      overflow = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_188);
      iVar2 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                          (bigint *)local_188);
      if ((0 < iVar2) || ((iVar2 == 0 && (overflow % 2 != 0)))) {
        if (overflow == 9) {
          pcVar6 = buffer<char>::operator[]<int>(buf,num_digits + -1);
          *pcVar6 = ':';
          local_358 = num_digits + -1;
          while( true ) {
            bVar7 = false;
            if (0 < local_358) {
              pcVar6 = buffer<char>::operator[]<int>(buf,local_358);
              bVar7 = *pcVar6 == ':';
            }
            if (!bVar7) break;
            pcVar6 = buffer<char>::operator[]<int>(buf,local_358);
            *pcVar6 = '0';
            pcVar6 = buffer<char>::operator[]<int>(buf,local_358 + -1);
            *pcVar6 = *pcVar6 + '\x01';
            local_358 = local_358 + -1;
          }
          pcVar6 = buffer<char>::operator[]<int>(buf,0);
          if (*pcVar6 == ':') {
            pcVar6 = buffer<char>::operator[]<int>(buf,0);
            *pcVar6 = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_0014c93a;
        }
        overflow = overflow + 1;
      }
      pcVar6 = buffer<char>::operator[]<int>(buf,num_digits + -1);
      *pcVar6 = (char)overflow + '0';
    }
  }
LAB_0014c93a:
  bigint::~bigint((bigint *)&upper);
  bigint::~bigint((bigint *)&upper_store.exp_);
  bigint::~bigint((bigint *)local_188);
  bigint::~bigint((bigint *)&denominator.exp_);
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}